

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Delaunay::Delaunay(Delaunay *this,coord_index_t dimension)

{
  coord_index_t dimension_local;
  Delaunay *this_local;
  
  Counted::Counted(&this->super_Counted);
  (this->super_Counted)._vptr_Counted = (_func_int **)&PTR__Delaunay_002ba7f8;
  vector<int>::vector(&this->v_to_cell_);
  vector<int>::vector(&this->cicl_);
  PackedArrays::PackedArrays(&this->neighbors_);
  set_dimension(this,dimension);
  this->vertices_ = (double *)0x0;
  this->nb_vertices_ = 0;
  this->nb_cells_ = 0;
  this->cell_to_v_ = (signed_index_t *)0x0;
  this->cell_to_cell_ = (signed_index_t *)0x0;
  this->is_locked_ = false;
  this->store_neighbors_ = false;
  this->default_nb_neighbors_ = 0x1e;
  this->constraints_ = (Mesh *)0x0;
  this->do_reorder_ = true;
  this->refine_ = false;
  this->quality_ = 2.0;
  this->store_cicl_ = false;
  this->keep_infinite_ = false;
  this->nb_finite_cells_ = 0;
  this->keep_regions_ = false;
  return;
}

Assistant:

Delaunay::Delaunay(coord_index_t dimension) {
        set_dimension(dimension);
        vertices_ = nullptr;
        nb_vertices_ = 0;
        nb_cells_ = 0;
        cell_to_v_ = nullptr;
        cell_to_cell_ = nullptr;
        is_locked_ = false;
        store_neighbors_ = false;
        default_nb_neighbors_ = 30;
        constraints_ = nullptr;
        do_reorder_ = true;
        refine_ = false;
        quality_ = 2.0;
        store_cicl_ = false;
        keep_infinite_ = false;
        nb_finite_cells_ = 0;
	keep_regions_ = false;
    }